

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseLightChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  uint uVar1;
  int iVar2;
  reference ppaVar3;
  float fVar4;
  float fVar5;
  aiColor3D local_34;
  value_type local_28;
  aiLight *light;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar1 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar1 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      light._4_4_ = chunkSize + -6;
    } while (light._4_4_ < 1);
    this_00 = this->stream;
    iVar2 = StreamReader<false,_false>::GetCurrentPos(this_00);
    light._0_4_ = StreamReader<false,_false>::SetReadLimit(this_00,iVar2 + light._4_4_);
    ppaVar3 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::back(&this->mScene->mLights);
    local_28 = *ppaVar3;
    if ((oldReadLimit._2_2_ == 0x10) || (oldReadLimit._2_2_ == 0x13)) {
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      (local_28->mColorDiffuse).r = fVar5 * (local_28->mColorDiffuse).r;
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      (local_28->mColorDiffuse).g = fVar5 * (local_28->mColorDiffuse).g;
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      (local_28->mColorDiffuse).b = fVar5 * (local_28->mColorDiffuse).b;
    }
    else if (oldReadLimit._2_2_ == 0x4610) {
      local_28->mType = aiLightSource_SPOT;
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      (local_28->mDirection).x = fVar5 - (local_28->mPosition).x;
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      (local_28->mDirection).y = fVar5 - (local_28->mPosition).y;
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      (local_28->mDirection).z = fVar5 - (local_28->mPosition).z;
      aiVector3t<float>::Normalize(&local_28->mDirection);
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      local_28->mAngleInnerCone = fVar5 * 0.017453292;
      fVar5 = local_28->mAngleInnerCone;
      fVar4 = StreamReader<false,_false>::GetF4(this->stream);
      local_28->mAngleOuterCone = fVar4 * 0.017453292 + fVar5;
    }
    else if (oldReadLimit._2_2_ == 0x4625) {
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      local_28->mAttenuationLinear = fVar5;
    }
    else if (oldReadLimit._2_2_ == 0x465b) {
      fVar5 = StreamReader<false,_false>::GetF4(this->stream);
      aiColor3D::operator*(&local_34,fVar5);
      aiColor3D::operator=(&local_28->mColorDiffuse,&local_34);
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,(uint)light);
    uVar1 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar1 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseLightChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    aiLight* light = mScene->mLights.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_DL_SPOTLIGHT:
        // Now we can be sure that the light is a spot light
        light->mType = aiLightSource_SPOT;

        // We wouldn't need to normalize here, but we do it
        light->mDirection.x = stream->GetF4() - light->mPosition.x;
        light->mDirection.y = stream->GetF4() - light->mPosition.y;
        light->mDirection.z = stream->GetF4() - light->mPosition.z;
        light->mDirection.Normalize();

        // Now the hotspot and falloff angles - in degrees
        light->mAngleInnerCone = AI_DEG_TO_RAD( stream->GetF4() );

        // FIX: the falloff angle is just an offset
        light->mAngleOuterCone = light->mAngleInnerCone+AI_DEG_TO_RAD( stream->GetF4() );
        break;

        // intensity multiplier
    case Discreet3DS::CHUNK_DL_MULTIPLIER:
        light->mColorDiffuse = light->mColorDiffuse * stream->GetF4();
        break;

        // light color
    case Discreet3DS::CHUNK_RGBF:
    case Discreet3DS::CHUNK_LINRGBF:
        light->mColorDiffuse.r *= stream->GetF4();
        light->mColorDiffuse.g *= stream->GetF4();
        light->mColorDiffuse.b *= stream->GetF4();
        break;

        // light attenuation
    case Discreet3DS::CHUNK_DL_ATTENUATE:
        light->mAttenuationLinear = stream->GetF4();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}